

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_int,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,uint value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  add_thousands_sep<wchar_t> *paVar1;
  int in_EDX;
  uint uVar2;
  uint in_ESI;
  long in_RDI;
  uint index;
  uint index_1;
  wchar_t *end;
  add_thousands_sep<wchar_t> *this;
  add_thousands_sep<wchar_t> *paVar3;
  
  paVar1 = (add_thousands_sep<wchar_t> *)(in_RDI + (long)in_EDX * 4);
  this = paVar1;
  while (99 < in_ESI) {
    uVar2 = (in_ESI % 100) * 2;
    in_ESI = in_ESI / 100;
    paVar3 = (add_thousands_sep<wchar_t> *)((long)(this + 0xffffffffffffffff) + 0x14);
    *(int *)((long)(this + 0xffffffffffffffff) + 0x14) =
         (int)(char)basic_data<void>::DIGITS[uVar2 + 1];
    add_thousands_sep<wchar_t>::operator()(paVar3,(wchar_t **)CONCAT44(in_ESI,in_EDX));
    this = (add_thousands_sep<wchar_t> *)((long)(paVar3 + 0xffffffffffffffff) + 0x14);
    *(int *)((long)(paVar3 + 0xffffffffffffffff) + 0x14) =
         (int)(char)basic_data<void>::DIGITS[uVar2];
    add_thousands_sep<wchar_t>::operator()(this,(wchar_t **)CONCAT44(in_ESI,in_EDX));
  }
  if (in_ESI < 10) {
    *(wchar_t *)((long)(this + 0xffffffffffffffff) + 0x14) = in_ESI + L'0';
  }
  else {
    paVar3 = (add_thousands_sep<wchar_t> *)((long)(this + 0xffffffffffffffff) + 0x14);
    *(int *)((long)(this + 0xffffffffffffffff) + 0x14) =
         (int)(char)basic_data<void>::DIGITS[in_ESI * 2 + 1];
    add_thousands_sep<wchar_t>::operator()(paVar3,(wchar_t **)CONCAT44(in_ESI,in_EDX));
    *(int *)((long)(paVar3 + 0xffffffffffffffff) + 0x14) =
         (int)(char)basic_data<void>::DIGITS[in_ESI * 2];
  }
  return (wchar_t *)paVar1;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}